

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O1

void vkt::pipeline::multisample::uploadVertexDataNdcScreen
               (Allocation *vertexBufferAllocation,VertexDataDesc *vertexDataDescripton,
               Vec2 *screenSize)

{
  pointer __src;
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  vertices;
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  local_48;
  VertexDataNdcScreen local_30;
  
  local_48.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30.positionNdc.m_data[0] = -1.0;
  local_30.positionNdc.m_data[1] = -1.0;
  local_30.positionNdc.m_data[2] = 0.0;
  local_30.positionNdc.m_data[3] = 1.0;
  local_30.positionScreen.m_data[0] = 0.0;
  local_30.positionScreen.m_data[1] = 0.0;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcScreen>(&local_48,&local_30);
  local_30.positionNdc.m_data[0] = 1.0;
  local_30.positionNdc.m_data[1] = -1.0;
  local_30.positionNdc.m_data[2] = 0.0;
  local_30.positionNdc.m_data[3] = 1.0;
  local_30.positionScreen.m_data[1] = 0.0;
  local_30.positionScreen.m_data[0] = screenSize->m_data[0];
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcScreen>(&local_48,&local_30);
  local_30.positionNdc.m_data[0] = -1.0;
  local_30.positionNdc.m_data[1] = 1.0;
  local_30.positionNdc.m_data[2] = 0.0;
  local_30.positionNdc.m_data[3] = 1.0;
  local_30.positionScreen.m_data = (float  [2])((ulong)(uint)screenSize->m_data[1] << 0x20);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcScreen>(&local_48,&local_30);
  local_30.positionScreen = *(Vec2 *)screenSize->m_data;
  local_30.positionNdc.m_data[0] = 1.0;
  local_30.positionNdc.m_data[1] = 1.0;
  local_30.positionNdc.m_data[2] = 0.0;
  local_30.positionNdc.m_data[3] = 1.0;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcScreen>(&local_48,&local_30);
  __src = (pointer)0x0;
  if (local_48.
      super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __src = local_48.
            super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
            ._M_impl.super__Vector_impl_data._M_start;
  }
  memcpy(vertexBufferAllocation->m_hostPtr,__src,vertexDataDescripton->dataSize);
  if (local_48.
      super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void uploadVertexDataNdcScreen (const Allocation& vertexBufferAllocation, const MultisampleInstanceBase::VertexDataDesc& vertexDataDescripton, const tcu::Vec2& screenSize)
{
	std::vector<VertexDataNdcScreen> vertices;

	vertices.push_back(VertexDataNdcScreen(tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec2(0.0f, 0.0f)));
	vertices.push_back(VertexDataNdcScreen(tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec2(screenSize.x(), 0.0f)));
	vertices.push_back(VertexDataNdcScreen(tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f), tcu::Vec2(0.0f, screenSize.y())));
	vertices.push_back(VertexDataNdcScreen(tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f), tcu::Vec2(screenSize.x(), screenSize.y())));

	deMemcpy(vertexBufferAllocation.getHostPtr(), dataPointer(vertices), static_cast<std::size_t>(vertexDataDescripton.dataSize));
}